

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O2

bool __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,float>::
is_dominated_by<boost::container::flat_set<int,std::less<int>,void>>
          (Flag_complex_edge_collapser<int,float> *this,flat_set<int,_std::less<int>,_void> *e_ngb,
          int c,float f)

{
  pair<int,_float> *ppVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  stored_size_type sVar5;
  pointer bg;
  reference piVar6;
  vec_iterator<std::pair<int,_float>_*,_false> *pvVar7;
  vec_iterator<int_*,_true> *pvVar8;
  iterator ci;
  const_iterator eni;
  vec_iterator<std::pair<int,_float>_*,_false> local_38;
  vec_iterator<int_*,_true> local_30;
  
  local_38.m_ptr = *(pair<int,_float> **)(*(long *)this + (long)c * 0x18);
  lVar4 = *(long *)(*(long *)this + 8 + (long)c * 0x18);
  local_30.m_ptr =
       (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).m_data
       .m_seq.m_holder.m_start;
  sVar5 = (e_ngb->super_flat_tree<int,_boost::move_detail::identity<int>,_std::less<int>,_void>).
          m_data.m_seq.m_holder.m_size;
  if (sVar5 == 0) {
    __assert_fail("eni != ene",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa5,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, float>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = float, Ngb = boost::container::flat_set<int>]"
                 );
  }
  if (lVar4 == 0) {
    __assert_fail("ci != ce",
                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Collapse/include/gudhi/Flag_complex_edge_collapser.h"
                  ,0xa6,
                  "bool Gudhi::collapse::Flag_complex_edge_collapser<int, float>::is_dominated_by(const Ngb &, Vertex, Filtration_value) [Vertex = int, Filtration_value = float, Ngb = boost::container::flat_set<int>]"
                 );
  }
  ppVar1 = local_38.m_ptr + lVar4;
  piVar2 = local_30.m_ptr + sVar5;
  while( true ) {
    piVar6 = boost::container::vec_iterator<int_*,_true>::operator*(&local_30);
    iVar3 = *piVar6;
    while ((local_38.m_ptr)->first < iVar3) {
      pvVar7 = boost::container::vec_iterator<std::pair<int,_float>_*,_false>::operator++(&local_38)
      ;
      if (pvVar7->m_ptr == ppVar1) {
        return false;
      }
    }
    if (iVar3 < (local_38.m_ptr)->first) {
      return false;
    }
    if (f < (local_38.m_ptr)->second) {
      return false;
    }
    pvVar8 = boost::container::vec_iterator<int_*,_true>::operator++(&local_30);
    if (pvVar8->m_ptr == piVar2) break;
    pvVar7 = boost::container::vec_iterator<std::pair<int,_float>_*,_false>::operator++(&local_38);
    if (pvVar7->m_ptr == ppVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

bool is_dominated_by(Ngb const& e_ngb, Vertex c, Filtration_value f){
    // The best strategy probably depends on the distribution, how sparse / dense the adjacency matrix is,
    // how (un)balanced the sizes of e_ngb and nc are.
    // Some efficient operations on sets work best with bitsets, although the need for a map complicates things.
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    for(auto v : e_ngb) {
      // if(v==c)continue;
      if(neighbors_dense(v,c) > f) return false;
    }
    return true;
#else
    auto&&nc = neighbors[c];
    // if few neighbors, use dichotomy? Seems slower.
    // I tried storing a copy of neighbors as a vector<absl::flat_hash_map> and using it for nc, but it was
    // a bit slower here. It did help with neighbors[dominator].find(w) in the main function though,
    // sometimes enough, sometimes not.
    auto ci = nc.begin();
    auto ce = nc.end();
    auto eni = e_ngb.begin();
    auto ene = e_ngb.end();
    assert(eni != ene);
    assert(ci != ce);
    // if(*eni == c && ++eni == ene) return true;
    for(;;){
      Vertex ve = *eni;
      Vertex vc = ci->first;
      while(ve > vc) {
        // try a gallop strategy (exponential search)? Seems slower
        if(++ci == ce) return false;
        vc = ci->first;
      }
      if(ve < vc) return false;
      // ve == vc
      if(ci->second > f) return false;
      if(++eni == ene)return true;
      // If we stored an open neighborhood of c (excluding c), we would need to test for c here and before the loop
      // if(*eni == c && ++eni == ene)return true;
      if(++ci == ce) return false;
    }
#endif
  }